

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

void __thiscall de::cmdline::detail::Parser::help(Parser *this,ostream *str)

{
  ostream *poVar1;
  OptInfo *opt;
  pointer pOVar2;
  char *pcVar3;
  undefined8 *puVar4;
  
  pOVar2 = (this->m_options).
           super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pOVar2 == (this->m_options).
                  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    std::operator<<(str,"  ");
    if (pOVar2->shortName == (char *)0x0) {
LAB_009947a2:
      pcVar3 = pOVar2->longName;
    }
    else {
      poVar1 = std::operator<<(str,"-");
      std::operator<<(poVar1,pOVar2->shortName);
      pcVar3 = pOVar2->longName;
      if (pcVar3 != (char *)0x0 && pOVar2->shortName != (char *)0x0) {
        std::operator<<(str,", ");
        goto LAB_009947a2;
      }
    }
    if (pcVar3 != (char *)0x0) {
      poVar1 = std::operator<<(str,"--");
      std::operator<<(poVar1,pOVar2->longName);
    }
    if (pOVar2->namedValues == (void *)0x0) {
      pcVar3 = "=<value>";
      if (pOVar2->isFlag == false) goto LAB_0099481c;
    }
    else {
      std::operator<<(str,"=[");
      for (puVar4 = (undefined8 *)pOVar2->namedValues;
          puVar4 != (undefined8 *)pOVar2->namedValuesEnd;
          puVar4 = (undefined8 *)((long)puVar4 + pOVar2->namedValueStride)) {
        if (puVar4 != (undefined8 *)pOVar2->namedValues) {
          std::operator<<(str,"|");
        }
        std::operator<<(str,(char *)*puVar4);
      }
      pcVar3 = "]";
LAB_0099481c:
      std::operator<<(str,pcVar3);
    }
    std::operator<<(str,"\n");
    if (pOVar2->description != (char *)0x0) {
      poVar1 = std::operator<<(str,"    ");
      poVar1 = std::operator<<(poVar1,pOVar2->description);
      std::operator<<(poVar1,"\n");
    }
    if (pOVar2->defaultValue != (char *)0x0) {
      poVar1 = std::operator<<(str,"    default: \'");
      poVar1 = std::operator<<(poVar1,pOVar2->defaultValue);
      std::operator<<(poVar1,"\'\n");
    }
    std::operator<<(str,"\n");
    pOVar2 = pOVar2 + 1;
  } while( true );
}

Assistant:

void Parser::help (std::ostream& str) const
{
	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); ++optIter)
	{
		const OptInfo& opt = *optIter;

		str << "  ";
		if (opt.shortName)
			str << "-" << opt.shortName;

		if (opt.shortName && opt.longName)
			str << ", ";

		if (opt.longName)
			str << "--" << opt.longName;

		if (opt.namedValues)
		{
			str << "=[";

			for (const void* curValue = opt.namedValues; curValue != opt.namedValuesEnd; curValue = (const void*)((deUintptr)curValue + opt.namedValueStride))
			{
				if (curValue != opt.namedValues)
					str << "|";
				str << getNamedValueName(curValue);
			}

			str << "]";
		}
		else if (!opt.isFlag)
			str << "=<value>";

		str << "\n";

		if (opt.description)
			str << "    " << opt.description << "\n";

		if (opt.defaultValue)
			str << "    default: '" << opt.defaultValue << "'\n";

		str << "\n";
	}
}